

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O0

void P_InitEffects(void)

{
  DWORD DVar1;
  uint32 uVar2;
  ColorList *pCStack_10;
  int kind;
  ColorList *color;
  
  pCStack_10 = Colors;
  P_InitParticles();
  for (; DVar1 = gameinfo.defaultbloodparticlecolor, pCStack_10->color != (int *)0x0;
      pCStack_10 = pCStack_10 + 1) {
    uVar2 = ParticleColor((uint)pCStack_10->r,(uint)pCStack_10->g,(uint)pCStack_10->b);
    *pCStack_10->color = uVar2;
  }
  blood1 = ParticleColor(gameinfo.defaultbloodparticlecolor);
  blood2 = ParticleColor(((int)DVar1 >> 0x10 & 0xffU) / 3,((int)DVar1 >> 8 & 0xffU) / 3,
                         (DVar1 & 0xff) / 3);
  return;
}

Assistant:

void P_InitEffects ()
{
	const struct ColorList *color = Colors;

	P_InitParticles();
	while (color->color)
	{
		*(color->color) = ParticleColor(color->r, color->g, color->b);
		color++;
	}

	int kind = gameinfo.defaultbloodparticlecolor;
	blood1 = ParticleColor(kind);
	blood2 = ParticleColor(RPART(kind)/3, GPART(kind)/3, BPART(kind)/3);
}